

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconhmp.cpp
# Opt level: O2

CVmFmtTabStop * CVmFmtTabStop::find(CVmHashTable *hashtab,wchar_t *id,int create)

{
  err_frame_t *peVar1;
  CVmException *pCVar2;
  size_t sVar3;
  wchar_t *dst;
  undefined8 *puVar4;
  long *plVar5;
  size_t sVar6;
  CVmHashEntry *entry;
  err_frame_t err_cur__;
  
  dst = (wchar_t *)0x0;
  sVar3 = fold_case((wchar_t *)0x0,id);
  if (sVar3 != 0) {
    dst = (wchar_t *)operator_new__(-(ulong)(sVar3 + 1 >> 0x3e != 0) | sVar3 * 4 + 4);
  }
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  err_cur__.prv_ = (err_frame_t *)*puVar4;
  plVar5 = (long *)_ZTW11G_err_frame();
  *plVar5 = (long)&err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ == 0) {
    if (dst != (wchar_t *)0x0) {
      fold_case(dst,id);
      id = dst;
    }
    sVar6 = wcslen(id);
    entry = CVmHashTable::find(hashtab,(char *)id,sVar6 << 2);
    if ((create != 0) && (entry == (CVmHashEntry *)0x0)) {
      entry = (CVmHashEntry *)operator_new(0x28);
      CVmFmtTabStop((CVmFmtTabStop *)entry,(char *)id,sVar6 << 2);
      CVmHashTable::add(hashtab,entry);
    }
  }
  else {
    entry = (CVmHashEntry *)0x0;
  }
  if ((-1 < (short)err_cur__.state_) &&
     (err_cur__.state_ = err_cur__.state_ | 0x8000, dst != (wchar_t *)0x0)) {
    operator_delete__(dst);
  }
  peVar1 = err_cur__.prv_;
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  *puVar4 = peVar1;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar4 & 2) != 0) {
      plVar5 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar5 + 0x10));
    }
    pCVar2 = err_cur__.exc_;
    plVar5 = (long *)_ZTW11G_err_frame();
    *(CVmException **)(*plVar5 + 0x10) = pCVar2;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  return (CVmFmtTabStop *)entry;
}

Assistant:

static CVmFmtTabStop *find(CVmHashTable *hashtab, wchar_t *id, int create)
    {
        /* 
         *   Get the length - in characters AND in bytes - of the new ID.
         *   We mostly work with the new ID in bytes rather than wchar_t's,
         *   because the underlying hash table does everything in bytes.  
         */
        
        /* 
         *   Convert the new ID to folded case.  The hash table doesn't deal
         *   with unicode case conversions, so we use a case-sensitive hash
         *   table and simply make sure we only give it lower-case
         *   characters.  
         */
        size_t flen = fold_case(0, id);
        wchar_t *fid = 0;
        if (flen != 0)
            fid = new wchar_t[flen+1];

        CVmFmtTabStop *entry = 0;
        err_try
        {
            /* do the folding if applicable */
            if (fid != 0)
            {
                fold_case(fid, id);
                id = fid;
            }

            /* get the folded ID length in characters and bytes */
            size_t id_chars = wcslen(id);
            size_t id_bytes = id_chars * sizeof(wchar_t);
            
            /* look for an existing tab-stop entry with the same ID */
            entry = (CVmFmtTabStop *)hashtab->find((char *)id, id_bytes);
            
            /* if we didn't find it, and they want to create it, do so */
            if (entry == 0 && create)
                hashtab->add(entry = new CVmFmtTabStop((char *)id, id_bytes));
        }